

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O1

unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true> __thiscall
duckdb::PhysicalCopyToFile::GetLocalSinkState(PhysicalCopyToFile *this,ExecutionContext *context)

{
  ThreadContext *pTVar1;
  vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_> *pvVar2;
  CopyToFunctionLocalState *in_RAX;
  CopyToFunctionGlobalState *gstate;
  pointer this_00;
  _Head_base<0UL,_duckdb::CopyToFunctionLocalState_*,_false> _Var3;
  undefined8 *in_RDX;
  templated_unique_single_t state;
  _Head_base<0UL,_duckdb::CopyToFunctionLocalState_*,_false> local_28;
  
  if (*(char *)((long)&context[0x28].client + 2) == '\x01') {
    gstate = (CopyToFunctionGlobalState *)
             unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator->((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                           *)(context + 3));
    local_28._M_head_impl = (CopyToFunctionLocalState *)operator_new(0x60);
    *(undefined4 *)&((local_28._M_head_impl)->super_LocalSinkState).partition_info.batch_index.index
         = 0xffffffff;
    *(undefined4 *)
     ((long)&((local_28._M_head_impl)->super_LocalSinkState).partition_info.batch_index.index + 4) =
         0xffffffff;
    *(undefined4 *)
     &((local_28._M_head_impl)->super_LocalSinkState).partition_info.min_batch_index.index =
         0xffffffff;
    *(undefined4 *)
     ((long)&((local_28._M_head_impl)->super_LocalSinkState).partition_info.min_batch_index.index +
     4) = 0xffffffff;
    pvVar2 = &((local_28._M_head_impl)->super_LocalSinkState).partition_info.partition_data.
              super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
    ;
    (pvVar2->
    super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar2->
    super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(pointer *)
     ((long)&((local_28._M_head_impl)->super_LocalSinkState).partition_info.partition_data.
             super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
             .
             super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
             ._M_impl + 0x10) = (pointer)0x0;
    ((local_28._M_head_impl)->super_LocalSinkState)._vptr_LocalSinkState =
         (_func_int **)&PTR__CopyToFunctionLocalState_019cc6d8;
    (local_28._M_head_impl)->global_state =
         (unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>)
         0x0;
    (local_28._M_head_impl)->local_state =
         (unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>_>)0x0
    ;
    (local_28._M_head_impl)->total_rows_copied = 0;
    (local_28._M_head_impl)->part_buffer =
         (unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>_>
          )0x0;
    (local_28._M_head_impl)->part_buffer_append_state =
         (unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>_>
          )0x0;
    (local_28._M_head_impl)->append_count = 0;
    this_00 = unique_ptr<duckdb::CopyToFunctionLocalState,_std::default_delete<duckdb::CopyToFunctionLocalState>,_true>
              ::operator->((unique_ptr<duckdb::CopyToFunctionLocalState,_std::default_delete<duckdb::CopyToFunctionLocalState>,_true>
                            *)&local_28);
    CopyToFunctionLocalState::InitializeAppendState
              (this_00,(ClientContext *)*in_RDX,(PhysicalCopyToFile *)context,gstate);
    _Var3._M_head_impl = local_28._M_head_impl;
  }
  else {
    pTVar1 = context[9].thread;
    local_28._M_head_impl = in_RAX;
    unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator*
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               (context + 0x22));
    (*(code *)pTVar1)(&local_28);
    _Var3._M_head_impl = (CopyToFunctionLocalState *)operator_new(0x60);
    *(undefined4 *)&((_Var3._M_head_impl)->super_LocalSinkState).partition_info.batch_index.index =
         0xffffffff;
    *(undefined4 *)
     ((long)&((_Var3._M_head_impl)->super_LocalSinkState).partition_info.batch_index.index + 4) =
         0xffffffff;
    *(undefined4 *)
     &((_Var3._M_head_impl)->super_LocalSinkState).partition_info.min_batch_index.index = 0xffffffff
    ;
    *(undefined4 *)
     ((long)&((_Var3._M_head_impl)->super_LocalSinkState).partition_info.min_batch_index.index + 4)
         = 0xffffffff;
    pvVar2 = &((_Var3._M_head_impl)->super_LocalSinkState).partition_info.partition_data.
              super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
    ;
    (pvVar2->
    super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar2->
    super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined1 (*) [16])
     ((long)&((_Var3._M_head_impl)->super_LocalSinkState).partition_info.partition_data.
             super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
             .
             super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
             ._M_impl + 0x10) = (undefined1  [16])0x0;
    ((_Var3._M_head_impl)->super_LocalSinkState)._vptr_LocalSinkState =
         (_func_int **)&PTR__CopyToFunctionLocalState_019cc6d8;
    ((_Var3._M_head_impl)->local_state).
    super_unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::LocalFunctionData_*,_std::default_delete<duckdb::LocalFunctionData>_>
    .super__Head_base<0UL,_duckdb::LocalFunctionData_*,_false>._M_head_impl =
         (LocalFunctionData *)local_28._M_head_impl;
    (_Var3._M_head_impl)->total_rows_copied = 0;
    (_Var3._M_head_impl)->part_buffer =
         (unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>_>
          )0x0;
    (_Var3._M_head_impl)->part_buffer_append_state =
         (unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>_>
          )0x0;
    (_Var3._M_head_impl)->append_count = 0;
  }
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = (_func_int **)_Var3._M_head_impl;
  return (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)
         (unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>)this;
}

Assistant:

unique_ptr<LocalSinkState> PhysicalCopyToFile::GetLocalSinkState(ExecutionContext &context) const {
	if (partition_output) {
		auto &g = sink_state->Cast<CopyToFunctionGlobalState>();

		auto state = make_uniq<CopyToFunctionLocalState>(nullptr);
		state->InitializeAppendState(context.client, *this, g);
		return std::move(state);
	}
	auto res = make_uniq<CopyToFunctionLocalState>(function.copy_to_initialize_local(context, *bind_data));
	return std::move(res);
}